

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::toNumber(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte c;
  bool bVar1;
  uint Value;
  uint index;
  uint uVar2;
  Cell CVar3;
  int iVar4;
  ulong uVar5;
  ulong local_58;
  int local_4c;
  
  requireDStackDepth(this,4,">NUMBER");
  this_00 = &this->dStack;
  Value = ForthStack<unsigned_int>::getTop(this_00);
  index = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,3);
  uVar5 = (ulong)uVar2;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,2);
  local_58 = (ulong)uVar2;
  CVar3 = getNumericBase(this);
  local_4c = -0x37;
  while( true ) {
    if (Value == 0) break;
    c = dataSpaceAt(this,index);
    bVar1 = isValidDigit(this,c);
    if (!bVar1) break;
    iVar4 = local_4c;
    if (c < 0x41) {
      iVar4 = -0x30;
    }
    if (0x60 < c) {
      iVar4 = -0x57;
    }
    index = index + 1;
    uVar5 = (uVar5 & 0xffffffff | local_58 << 0x20) * (ulong)CVar3 + (ulong)(iVar4 + (uint)c);
    local_58 = uVar5 >> 0x20;
    Value = Value - 1;
  }
  ForthStack<unsigned_int>::setTop(this_00,3,(uint)uVar5);
  ForthStack<unsigned_int>::setTop(this_00,2,(uint)local_58);
  ForthStack<unsigned_int>::setTop(this_00,1,index);
  ForthStack<unsigned_int>::setTop(this_00,0,Value);
  return;
}

Assistant:

void toNumber(){
			REQUIRE_DSTACK_DEPTH(4, ">NUMBER");
			Cell u1 = dStack.getTop();
			Cell caddr1 = dStack.getTop(1);
			DCell ud1(dStack.getTop(3),dStack.getTop(2));
			DCell base( getNumericBase() );
			while (u1 > 0){
				Char ch = getDataChar(caddr1);

				size_t position{} ;
				if (isValidDigit(ch)){
					position = digitValue(ch);
				} else {
					break;
				}
				--u1; ++caddr1;
				ud1.data_.Dcells = ud1.data_.Dcells * base.data_.Dcells + position;
			}
			dStack.setTop(3, ud1.data_.Cells.lo);
			dStack.setTop(2, ud1.data_.Cells.hi);
			dStack.setTop(1, caddr1);
			dStack.setTop(0, u1);


		}